

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_0::TestExceptionCallback::logMessage
          (TestExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  size_t sVar1;
  ArrayDisposer *pAVar2;
  ProcessContext *pPVar3;
  ArrayPtr<void_*const> trace;
  long lVar4;
  long lVar5;
  TestExceptionCallback *pTVar6;
  char *pcVar7;
  String *params_3;
  ArrayPtr<void_*> space;
  void *traceSpace [32];
  String *pSVar8;
  String *in_stack_fffffffffffffe60;
  String local_198;
  int local_17c;
  String local_178;
  long local_158;
  long lStack_150;
  undefined8 *local_148;
  char *local_140;
  kj local_138 [8];
  ArrayPtr<void_*const> in_stack_fffffffffffffed0;
  
  local_17c = line;
  local_140 = file;
  memset(local_138,0,0x100);
  space.size_ = 2;
  space.ptr = (void **)0x20;
  getStackTrace(local_138,space,line);
  if ((text->content).size_ < 2) {
    heapString(&local_198,"expectation failed",0x12);
    pcVar7 = (text->content).ptr;
    if (pcVar7 != (char *)0x0) {
      sVar1 = (text->content).size_;
      pAVar2 = (text->content).disposer;
      (text->content).ptr = (char *)0x0;
      (text->content).size_ = 0;
      (**pAVar2->_vptr_ArrayDisposer)(pAVar2,pcVar7,1,sVar1,sVar1,0);
    }
    (text->content).ptr = local_198.content.ptr;
    (text->content).size_ = local_198.content.size_;
    (text->content).disposer = local_198.content.disposer;
  }
  lStack_150 = (long)contextDepth;
  local_158 = CONCAT71(local_158._1_7_,0x5f);
  local_178.content.ptr = (char *)CONCAT71(local_178.content.ptr._1_7_,0x3a);
  params_3 = (String *)0x4f07f6;
  pSVar8 = text;
  str<kj::Repeat<char>,char_const*&,char,int&,char_const(&)[3],kj::String>
            (&local_198,(kj *)&local_158,(Repeat<char> *)&local_140,(char **)&local_178,
             (char *)&local_17c,(int *)0x4f07f6,(char (*) [3])text,in_stack_fffffffffffffe60);
  pcVar7 = (text->content).ptr;
  if (pcVar7 != (char *)0x0) {
    sVar1 = (text->content).size_;
    pAVar2 = (text->content).disposer;
    (text->content).ptr = (char *)0x0;
    (text->content).size_ = 0;
    params_3 = (String *)0x0;
    (**pAVar2->_vptr_ArrayDisposer)(pAVar2,pcVar7,1,sVar1,sVar1);
  }
  (text->content).ptr = local_198.content.ptr;
  (text->content).size_ = local_198.content.size_;
  (text->content).disposer = local_198.content.disposer;
  pTVar6 = this;
  if ((severity & ~WARNING) == ERROR) {
    do {
      LOCK();
      (pTVar6->sawError)._M_base._M_i = true;
      UNLOCK();
      pTVar6 = (pTVar6->mainThreadCallback).ptr;
    } while (pTVar6 != (TestExceptionCallback *)0x0);
    pPVar3 = this->context;
    trace.size_ = (size_t)pSVar8;
    trace.ptr = (void **)0x43d7d9;
    stringifyStackTraceAddresses(trace);
    stringifyStackTrace(in_stack_fffffffffffffed0);
    str<kj::String&,char_const(&)[9],kj::String,kj::String>
              (&local_198,(kj *)text,(String *)0x5037f7,(char (*) [9])&local_158,&local_178,params_3
              );
    pcVar7 = local_198.content.ptr;
    if (local_198.content.size_ == 0) {
      pcVar7 = "";
    }
    (*pPVar3->_vptr_ProcessContext[3])
              (pPVar3,pcVar7,local_198.content.size_ + (local_198.content.size_ == 0));
    sVar1 = local_198.content.size_;
    pcVar7 = local_198.content.ptr;
    if (local_198.content.ptr != (char *)0x0) {
      local_198.content.ptr = (char *)0x0;
      local_198.content.size_ = 0;
      (**(local_198.content.disposer)->_vptr_ArrayDisposer)
                (local_198.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
    sVar1 = local_178.content.size_;
    pcVar7 = local_178.content.ptr;
    if (local_178.content.ptr != (char *)0x0) {
      local_178.content.ptr = (char *)0x0;
      local_178.content.size_ = 0;
      (**(local_178.content.disposer)->_vptr_ArrayDisposer)
                (local_178.content.disposer,pcVar7,1,sVar1,sVar1,0);
    }
    lVar5 = lStack_150;
    lVar4 = local_158;
    if (local_158 != 0) {
      local_158._0_1_ = '\0';
      local_158._1_1_ = '\0';
      local_158._2_1_ = '\0';
      local_158._3_1_ = '\0';
      local_158._4_1_ = '\0';
      local_158._5_1_ = '\0';
      local_158._6_1_ = '\0';
      local_158._7_1_ = '\0';
      lStack_150 = 0;
      (**(code **)*local_148)(local_148,lVar4,1,lVar5,lVar5,0);
    }
  }
  else {
    if (local_198.content.size_ == 0) {
      local_198.content.ptr = "";
    }
    (*this->context->_vptr_ProcessContext[2])
              (this->context,local_198.content.ptr,
               local_198.content.size_ + (local_198.content.size_ == 0));
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    void* traceSpace[32]{};
    auto trace = getStackTrace(traceSpace, 2);

    if (text.size() == 0) {
      text = kj::heapString("expectation failed");
    }

    text = kj::str(kj::repeat('_', contextDepth), file, ':', line, ": ", kj::mv(text));

    if (severity == LogSeverity::ERROR || severity == LogSeverity::FATAL) {
      fail();
      context.error(kj::str(text, "\nstack: ", stringifyStackTraceAddresses(trace), stringifyStackTrace(trace)));
    } else {
      context.warning(text);
    }
  }